

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O3

bool SHA1_ValidateHelper(char *str,ON__UINT8 *standard)

{
  undefined4 uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ON__UINT64 sizeof_buffer;
  ON__UINT64 OVar6;
  ON__UINT64 sizeof_buffer_00;
  ON__UINT64 sizeof_buffer_01;
  ON__UINT64 sizeof_buffer_02;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ON_SHA1_Hash sha1_digest1;
  ON_SHA1_Hash sha1_digest;
  char *local_100;
  long local_f8;
  ON_SHA1_Hash local_e0;
  ON_SHA1_Hash local_cc;
  ON_SHA1 local_b8;
  
  iVar5 = ON_String::Length(str);
  local_b8.m_state[2] = 0;
  local_b8.m_state[3] = 0;
  local_b8.m_state[4] = 0;
  local_b8.m_bit_count[0] = 0;
  local_b8.m_bit_count[1] = 0;
  local_b8.m_state[0] = 0;
  local_b8.m_state[1] = 0;
  local_b8.m_buffer[0x30] = '\0';
  local_b8.m_buffer[0x31] = '\0';
  local_b8.m_buffer[0x32] = '\0';
  local_b8.m_buffer[0x33] = '\0';
  local_b8.m_buffer[0x34] = '\0';
  local_b8.m_buffer[0x35] = '\0';
  local_b8.m_buffer[0x36] = '\0';
  local_b8.m_buffer[0x37] = '\0';
  local_b8.m_buffer[0x38] = '\0';
  local_b8.m_buffer[0x39] = '\0';
  local_b8.m_buffer[0x3a] = '\0';
  local_b8.m_buffer[0x3b] = '\0';
  local_b8.m_buffer[0x3c] = '\0';
  local_b8.m_buffer[0x3d] = '\0';
  local_b8.m_buffer[0x3e] = '\0';
  local_b8.m_buffer[0x3f] = '\0';
  local_b8.m_buffer[0x20] = '\0';
  local_b8.m_buffer[0x21] = '\0';
  local_b8.m_buffer[0x22] = '\0';
  local_b8.m_buffer[0x23] = '\0';
  local_b8.m_buffer[0x24] = '\0';
  local_b8.m_buffer[0x25] = '\0';
  local_b8.m_buffer[0x26] = '\0';
  local_b8.m_buffer[0x27] = '\0';
  local_b8.m_buffer[0x28] = '\0';
  local_b8.m_buffer[0x29] = '\0';
  local_b8.m_buffer[0x2a] = '\0';
  local_b8.m_buffer[0x2b] = '\0';
  local_b8.m_buffer[0x2c] = '\0';
  local_b8.m_buffer[0x2d] = '\0';
  local_b8.m_buffer[0x2e] = '\0';
  local_b8.m_buffer[0x2f] = '\0';
  local_b8.m_buffer[0x10] = '\0';
  local_b8.m_buffer[0x11] = '\0';
  local_b8.m_buffer[0x12] = '\0';
  local_b8.m_buffer[0x13] = '\0';
  local_b8.m_buffer[0x14] = '\0';
  local_b8.m_buffer[0x15] = '\0';
  local_b8.m_buffer[0x16] = '\0';
  local_b8.m_buffer[0x17] = '\0';
  local_b8.m_buffer[0x18] = '\0';
  local_b8.m_buffer[0x19] = '\0';
  local_b8.m_buffer[0x1a] = '\0';
  local_b8.m_buffer[0x1b] = '\0';
  local_b8.m_buffer[0x1c] = '\0';
  local_b8.m_buffer[0x1d] = '\0';
  local_b8.m_buffer[0x1e] = '\0';
  local_b8.m_buffer[0x1f] = '\0';
  local_b8.m_buffer[0] = '\0';
  local_b8.m_buffer[1] = '\0';
  local_b8.m_buffer[2] = '\0';
  local_b8.m_buffer[3] = '\0';
  local_b8.m_buffer[4] = '\0';
  local_b8.m_buffer[5] = '\0';
  local_b8.m_buffer[6] = '\0';
  local_b8.m_buffer[7] = '\0';
  local_b8.m_buffer[8] = '\0';
  local_b8.m_buffer[9] = '\0';
  local_b8.m_buffer[10] = '\0';
  local_b8.m_buffer[0xb] = '\0';
  local_b8.m_buffer[0xc] = '\0';
  local_b8.m_buffer[0xd] = '\0';
  local_b8.m_buffer[0xe] = '\0';
  local_b8.m_buffer[0xf] = '\0';
  local_b8.m_byte_count = 0;
  local_b8.m_status_bits = 0;
  local_b8.m_reserved = 0;
  ON_SHA1_Hash::ON_SHA1_Hash(&local_b8.m_sha1_hash);
  sizeof_buffer_00 = (ON__UINT64)iVar5;
  ON_SHA1::AccumulateBytes(&local_b8,str,sizeof_buffer_00);
  ON_SHA1::Hash(&local_cc,&local_b8);
  auVar8[0] = -(local_cc.m_digest[0] == *standard);
  auVar8[1] = -(local_cc.m_digest[1] == standard[1]);
  auVar8[2] = -(local_cc.m_digest[2] == standard[2]);
  auVar8[3] = -(local_cc.m_digest[3] == standard[3]);
  auVar8[4] = -(local_cc.m_digest[4] == standard[4]);
  auVar8[5] = -(local_cc.m_digest[5] == standard[5]);
  auVar8[6] = -(local_cc.m_digest[6] == standard[6]);
  auVar8[7] = -(local_cc.m_digest[7] == standard[7]);
  auVar8[8] = -(local_cc.m_digest[8] == standard[8]);
  auVar8[9] = -(local_cc.m_digest[9] == standard[9]);
  auVar8[10] = -(local_cc.m_digest[10] == standard[10]);
  auVar8[0xb] = -(local_cc.m_digest[0xb] == standard[0xb]);
  auVar8[0xc] = -(local_cc.m_digest[0xc] == standard[0xc]);
  auVar8[0xd] = -(local_cc.m_digest[0xd] == standard[0xd]);
  auVar8[0xe] = -(local_cc.m_digest[0xe] == standard[0xe]);
  auVar8[0xf] = -(local_cc.m_digest[0xf] == standard[0xf]);
  uVar1 = *(undefined4 *)(standard + 0x10);
  auVar9[0] = -(local_cc.m_digest[0x10] == (char)uVar1);
  auVar9[1] = -(local_cc.m_digest[0x11] == (char)((uint)uVar1 >> 8));
  auVar9[2] = -(local_cc.m_digest[0x12] == (char)((uint)uVar1 >> 0x10));
  auVar9[3] = -(local_cc.m_digest[0x13] == (char)((uint)uVar1 >> 0x18));
  auVar9[4] = 0xff;
  auVar9[5] = 0xff;
  auVar9[6] = 0xff;
  auVar9[7] = 0xff;
  auVar9[8] = 0xff;
  auVar9[9] = 0xff;
  auVar9[10] = 0xff;
  auVar9[0xb] = 0xff;
  auVar9[0xc] = 0xff;
  auVar9[0xd] = 0xff;
  auVar9[0xe] = 0xff;
  auVar9[0xf] = 0xff;
  auVar9 = auVar9 & auVar8;
  if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) == 0xffff) {
    if (iVar5 < 0) {
      bVar7 = local_b8.m_byte_count == sizeof_buffer_00;
    }
    else {
      bVar7 = true;
      local_f8 = 1;
      sizeof_buffer_01 = 0;
      OVar6 = sizeof_buffer_00;
      local_100 = str;
      do {
        if (!bVar7) {
          return false;
        }
        sizeof_buffer_02 = 0;
        sizeof_buffer = OVar6;
        do {
          local_b8.m_byte_count = 0;
          local_b8.m_bit_count[0] = 0;
          local_b8.m_bit_count[1] = 0;
          local_b8.m_state[0] = 0x67452301;
          local_b8.m_state[1] = 0xefcdab89;
          local_b8.m_state[2] = 0x98badcfe;
          local_b8.m_state[3] = 0x10325476;
          local_b8.m_state[4] = 0xc3d2e1f0;
          local_b8.m_status_bits = 1;
          ON_SHA1::AccumulateBytes(&local_b8,str,sizeof_buffer_01);
          ON_SHA1::Hash(&local_e0,&local_b8);
          ON_SHA1::AccumulateBytes(&local_b8,str + sizeof_buffer_01,sizeof_buffer_02);
          ON_SHA1::Hash(&local_e0,&local_b8);
          ON_SHA1::AccumulateBytes(&local_b8,local_100 + sizeof_buffer_02,sizeof_buffer);
          ON_SHA1::Hash(&local_e0,&local_b8);
          bVar3 = local_cc.m_digest._16_4_ == local_e0.m_digest._16_4_;
          bVar4 = CONCAT17(local_cc.m_digest[7],
                           CONCAT16(local_cc.m_digest[6],
                                    CONCAT15(local_cc.m_digest[5],
                                             CONCAT14(local_cc.m_digest[4],
                                                      CONCAT13(local_cc.m_digest[3],
                                                               CONCAT12(local_cc.m_digest[2],
                                                                        CONCAT11(local_cc.m_digest
                                                                                 [1],local_cc.
                                                  m_digest[0]))))))) == local_e0.m_digest._0_8_;
          bVar2 = CONCAT17(local_cc.m_digest[0xf],
                           CONCAT16(local_cc.m_digest[0xe],
                                    CONCAT15(local_cc.m_digest[0xd],
                                             CONCAT14(local_cc.m_digest[0xc],
                                                      CONCAT13(local_cc.m_digest[0xb],
                                                               CONCAT12(local_cc.m_digest[10],
                                                                        CONCAT11(local_cc.m_digest
                                                                                 [9],local_cc.
                                                  m_digest[8]))))))) == local_e0.m_digest._8_8_;
          if ((long)sizeof_buffer_00 < (long)(local_f8 + sizeof_buffer_02)) break;
          sizeof_buffer_02 = sizeof_buffer_02 + 1;
          sizeof_buffer = sizeof_buffer - 1;
        } while ((bVar3 && bVar4) && bVar2);
        bVar7 = (bVar3 && bVar4) && bVar2;
        if ((long)sizeof_buffer_00 <= (long)sizeof_buffer_01) break;
        sizeof_buffer_01 = sizeof_buffer_01 + 1;
        OVar6 = OVar6 - 1;
        local_100 = local_100 + 1;
        local_f8 = local_f8 + 1;
      } while ((bVar3 && bVar4) && bVar2);
      bVar7 = ((bVar3 && bVar4) && bVar2) && (local_b8.m_byte_count == sizeof_buffer_00 && bVar7);
    }
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

static bool SHA1_ValidateHelper(
  const char* str,
  const ON__UINT8 standard[20]
  )
{
  const int str_length = ON_String::Length(str);
  ON_SHA1 sha1;
  sha1.AccumulateBytes(str, str_length);
  const ON_SHA1_Hash sha1_digest(sha1.Hash());
  if ( 0 != memcmp(standard, &sha1_digest, 20) )
    return false;

  bool rc = true;
  for (int i = 0; i <= str_length && rc; i++)
  {
    for (int j = 0; i+j <= str_length && rc; j++)
    {
      sha1.Reset();
      sha1.AccumulateBytes(str, i);
      sha1.Hash();
      sha1.AccumulateBytes(str+i, j);
      sha1.Hash();
      sha1.AccumulateBytes(str+i+j, str_length-i-j);
      ON_SHA1_Hash sha1_digest1(sha1.Hash());
      rc = ( sha1_digest == sha1_digest1 );
    }
  }

  if (rc)
  {
    if ( (ON__UINT64)str_length != sha1.ByteCount() )
      rc = false;
  }

  return rc;
}